

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void mul(double *ret,double *mat,double *vec,int16_t row,int16_t col)

{
  ushort uVar1;
  short sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (ret != vec) {
    uVar3 = 0;
    uVar1 = 0;
    if (0 < row) {
      uVar1 = row;
    }
    for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      ret[uVar3] = 0.0;
    }
    sVar2 = 0;
    uVar3 = 0;
    if (0 < col) {
      uVar3 = (ulong)(ushort)col;
    }
    for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        ret[uVar5] = mat[(short)(sVar2 + (short)uVar5)] * vec[uVar4] + ret[uVar5];
      }
      sVar2 = sVar2 + row;
    }
    return;
  }
  printf("%s pointer error !\n","mul");
  exit(-1);
}

Assistant:

inline void mul(double* ret, const double* mat, const double* vec, const int16_t row, const int16_t col) {
  int16_t i, j, idx;
#ifdef DEBUG_MODE
  if (ret == vec) {
    printf("%s pointer error !\n", __func__);
    exit(-1);
  }
#endif
  for (i = 0; i < row; i++) {
    ret[i] = 0.0;
  }

  for (j = 0; j < col; j++) {
    for (i = 0; i < row; i++) {
      idx = row * j + i;
      ret[i] += mat[idx] * vec[j];
    }
  }
}